

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

UChar32 __thiscall
icu_63::DataBuilderCollationIterator::nextCodePoint
          (DataBuilderCollationIterator *this,UErrorCode *param_1)

{
  short sVar1;
  UnicodeString *this_00;
  uint uVar2;
  int32_t iVar3;
  
  this_00 = this->s;
  sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this_00->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  uVar2 = 0xffffffff;
  if (this->pos != iVar3) {
    uVar2 = UnicodeString::char32At(this_00,this->pos);
    this->pos = (this->pos - (uint)(uVar2 < 0x10000)) + 2;
  }
  return uVar2;
}

Assistant:

UChar32
DataBuilderCollationIterator::nextCodePoint(UErrorCode & /*errorCode*/) {
    if(pos == s->length()) {
        return U_SENTINEL;
    }
    UChar32 c = s->char32At(pos);
    pos += U16_LENGTH(c);
    return c;
}